

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

PointerType * __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GetInvalidSchemaPointer
          (PointerType *__return_storage_ptr__,
          GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
          *this)

{
  bool bVar1;
  SchemaType *this_00;
  PointerType *rhs;
  GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
  *this_local;
  
  bVar1 = internal::Stack<rapidjson::CrtAllocator>::Empty(&this->schemaStack_);
  if (bVar1) {
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer(__return_storage_ptr__,(CrtAllocator *)0x0);
  }
  else {
    this_00 = CurrentSchema(this);
    rhs = internal::
          Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
          ::GetPointer(this_00);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GenericPointer(__return_storage_ptr__,rhs);
  }
  return __return_storage_ptr__;
}

Assistant:

PointerType GetInvalidSchemaPointer() const {
        return schemaStack_.Empty() ? PointerType() : CurrentSchema().GetPointer();
    }